

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_options.c
# Opt level: O3

int archive_set_filter_option(archive *_a,char *m,char *o,char *v)

{
  code *UNRECOVERED_JUMPTABLE;
  int iVar1;
  int iVar2;
  archive_string_conv *paVar3;
  
  paVar3 = _a[1].sconv;
  if (paVar3 == (archive_string_conv *)0x0) {
    iVar2 = -0x14;
  }
  else {
    iVar2 = -0x14;
    do {
      UNRECOVERED_JUMPTABLE = *(code **)&paVar3->from_cp;
      if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
        if (m == (char *)0x0) {
          iVar1 = (*UNRECOVERED_JUMPTABLE)(paVar3,o,v);
          if (iVar1 == -0x1e) {
            return -0x1e;
          }
          if (iVar1 == 0) {
            iVar2 = 0;
          }
        }
        else {
          iVar1 = strcmp((char *)paVar3->converter[1],m);
          if (iVar1 == 0) {
            iVar2 = (*UNRECOVERED_JUMPTABLE)(paVar3,o,v);
            return iVar2;
          }
        }
      }
      paVar3 = (archive_string_conv *)paVar3->to_charset;
    } while (paVar3 != (archive_string_conv *)0x0);
  }
  iVar1 = -0x15;
  if (iVar2 != -0x14) {
    iVar1 = iVar2;
  }
  if (m == (char *)0x0) {
    iVar1 = iVar2;
  }
  return iVar1;
}

Assistant:

static int
archive_set_filter_option(struct archive *_a, const char *m, const char *o,
    const char *v)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct archive_write_filter *filter;
	int r, rv = ARCHIVE_WARN;

	for (filter = a->filter_first; filter != NULL; filter = filter->next_filter) {
		if (filter->options == NULL)
			continue;
		if (m != NULL && strcmp(filter->name, m) != 0)
			continue;

		r = filter->options(filter, o, v);

		if (r == ARCHIVE_FATAL)
			return (ARCHIVE_FATAL);

		if (m != NULL)
			return (r);

		if (r == ARCHIVE_OK)
			rv = ARCHIVE_OK;
	}
	/* If the filter name didn't match, return a special code for
	 * _archive_set_option[s]. */
	if (rv == ARCHIVE_WARN && m != NULL)
		rv = ARCHIVE_WARN - 1;
	return (rv);
}